

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

void __thiscall
TasGrid::GridGlobal::updateGrid
          (GridGlobal *this,int depth,TypeDepth type,
          vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  MultiIndexSet *this_00;
  int cnum_outputs;
  MultiIndexSet MStack_58;
  
  cnum_outputs = (this->super_BaseCanonicalGrid).num_outputs;
  if ((cnum_outputs == 0) ||
     ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    makeGrid(this,(this->super_BaseCanonicalGrid).num_dimensions,cnum_outputs,depth,type,this->rule,
             anisotropic_weights,this->alpha,this->beta,(char *)0x0,level_limits);
  }
  else {
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])(this);
    selectTensors(&MStack_58,this,(long)(this->super_BaseCanonicalGrid).num_dimensions,depth,type,
                  anisotropic_weights,this->rule,level_limits);
    this_00 = &this->updated_tensors;
    MultiIndexSet::operator=(this_00,&MStack_58);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&MStack_58.indexes.super__Vector_base<int,_std::allocator<int>_>);
    MultiIndexSet::operator-(&MStack_58,this_00,&this->tensors);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&MStack_58.indexes.super__Vector_base<int,_std::allocator<int>_>);
    if (MStack_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        MStack_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      MultiIndexSet::operator+=(this_00,&this->tensors);
      proposeUpdatedTensors(this);
    }
  }
  return;
}

Assistant:

void GridGlobal::updateGrid(int depth, TypeDepth type, const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    if ((num_outputs == 0) || points.empty()){
        makeGrid(num_dimensions, num_outputs, depth, type, rule, anisotropic_weights, alpha, beta, 0, level_limits);
    }else{
        clearRefinement();

        updated_tensors = selectTensors((size_t) num_dimensions, depth, type, anisotropic_weights, rule, level_limits);

        if (!(updated_tensors - tensors).empty()){
            updated_tensors += tensors;
            proposeUpdatedTensors();
        }
    }
}